

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_metric_csv(REF_NODE ref_node,char *filename)

{
  REF_MPI ref_mpi_00;
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT item;
  REF_INT best;
  REF_DBL m [6];
  REF_DBL best_dist;
  REF_DBL dist;
  REF_INT donor;
  REF_INT node;
  REF_DBL radius;
  REF_LIST touching;
  REF_SEARCH ref_search;
  uint local_4e0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL col [12];
  void *local_460;
  REF_DBL *metric;
  REF_DBL *xyz;
  REF_INT ncol;
  REF_INT nline;
  char *token;
  char local_438 [6];
  char comma [2];
  char line [1024];
  FILE *file;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_NODE ref_node_local;
  
  ref_mpi_00 = ref_node->ref_mpi;
  token._6_1_ = ',';
  token._7_1_ = '\0';
  metric = (REF_DBL *)0x0;
  local_460 = (void *)0x0;
  if (ref_mpi_00->id == 0) {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7b1,
             "ref_part_metric_csv","unable to open file");
      return 2;
    }
    pcVar3 = fgets(local_438,0x400,__stream);
    if (local_438 != pcVar3) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7b2,
             "ref_part_metric_csv","read header");
      return 1;
    }
    printf("%s\n",local_438);
    xyz._4_4_ = 0;
    while (pcVar3 = fgets(local_438,0x400,__stream), local_438 == pcVar3) {
      xyz._0_4_ = 0;
      _ncol = strtok(local_438,(char *)((long)&token + 6));
      while (_ncol != (char *)0x0) {
        xyz._0_4_ = (int)xyz + 1;
        _ncol = strtok((char *)0x0,(char *)((long)&token + 6));
      }
      if ((int)xyz == 0xc) {
        xyz._4_4_ = xyz._4_4_ + 1;
      }
    }
    printf("nline %d \n",(ulong)xyz._4_4_);
    if ((int)(xyz._4_4_ * 3) < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7bf,
             "ref_part_metric_csv","malloc xyz of REF_DBL negative");
      return 1;
    }
    metric = (REF_DBL *)malloc((long)(int)(xyz._4_4_ * 3) << 3);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7bf,
             "ref_part_metric_csv","malloc xyz of REF_DBL NULL");
      return 2;
    }
    for (ref_private_macro_code_rss = 0;
        SBORROW4(ref_private_macro_code_rss,xyz._4_4_ * 3) !=
        (int)(ref_private_macro_code_rss + xyz._4_4_ * -3) < 0;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      metric[ref_private_macro_code_rss] = 0.0;
    }
    if ((int)(xyz._4_4_ * 6) < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7c0,
             "ref_part_metric_csv","malloc metric of REF_DBL negative");
      return 1;
    }
    local_460 = malloc((long)(int)(xyz._4_4_ * 6) << 3);
    if (local_460 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7c0,
             "ref_part_metric_csv","malloc metric of REF_DBL NULL");
      return 2;
    }
    for (ref_malloc_init_i_2 = 0;
        SBORROW4(ref_malloc_init_i_2,xyz._4_4_ * 6) !=
        (int)(ref_malloc_init_i_2 + xyz._4_4_ * -6) < 0;
        ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
      *(undefined8 *)((long)local_460 + (long)ref_malloc_init_i_2 * 8) = 0;
    }
    iVar1 = fseek(__stream,0,0);
    if (iVar1 != 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7c1,
             "ref_part_metric_csv","rewind");
      return 1;
    }
    pcVar3 = fgets(local_438,0x400,__stream);
    if (local_438 != pcVar3) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7c2,
             "ref_part_metric_csv","read header");
      return 1;
    }
    xyz._4_4_ = 0;
    while (pcVar3 = fgets(local_438,0x400,__stream), local_438 == pcVar3) {
      xyz._0_4_ = 0;
      _ncol = strtok(local_438,(char *)((long)&token + 6));
      while (_ncol != (char *)0x0) {
        if (0xb < (int)xyz) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x7c8,"ref_part_metric_csv","too many col");
          return 1;
        }
        dVar4 = atof(_ncol);
        *(double *)(&ref_malloc_init_i_1 + (long)(int)xyz * 2) = dVar4;
        xyz._0_4_ = (int)xyz + 1;
        _ncol = strtok((char *)0x0,(char *)((long)&token + 6));
      }
      if ((int)xyz == 0xc) {
        *(undefined8 *)((long)local_460 + (long)(int)(xyz._4_4_ * 6) * 8) = _ref_malloc_init_i_1;
        *(double *)((long)local_460 + (long)(int)(xyz._4_4_ * 6 + 1) * 8) = (col[0] + col[2]) * 0.5;
        *(double *)((long)local_460 + (long)(int)(xyz._4_4_ * 6 + 2) * 8) = (col[1] + col[5]) * 0.5;
        *(REF_DBL *)((long)local_460 + (long)(int)(xyz._4_4_ * 6 + 3) * 8) = col[3];
        *(double *)((long)local_460 + (long)(int)(xyz._4_4_ * 6 + 4) * 8) = (col[4] + col[6]) * 0.5;
        *(REF_DBL *)((long)local_460 + (long)(int)(xyz._4_4_ * 6 + 5) * 8) = col[7];
        metric[(int)(xyz._4_4_ * 3)] = col[8];
        metric[(int)(xyz._4_4_ * 3 + 1)] = col[9];
        metric[(int)(xyz._4_4_ * 3 + 2)] = col[10];
        xyz._4_4_ = xyz._4_4_ + 1;
      }
    }
    fclose(__stream);
  }
  ref_malloc_init_i_3 = ref_mpi_bcast(ref_mpi_00,(void *)((long)&xyz + 4),1,1);
  if (ref_malloc_init_i_3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7dc,
           "ref_part_metric_csv",(ulong)(uint)ref_malloc_init_i_3,"bcast line");
    return ref_malloc_init_i_3;
  }
  if (ref_mpi_00->id != 0) {
    if ((int)(xyz._4_4_ * 3) < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7de,
             "ref_part_metric_csv","malloc xyz of REF_DBL negative");
      return 1;
    }
    metric = (REF_DBL *)malloc((long)(int)(xyz._4_4_ * 3) << 3);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7de,
             "ref_part_metric_csv","malloc xyz of REF_DBL NULL");
      return 2;
    }
    for (ref_private_macro_code_rss_1 = 0;
        SBORROW4(ref_private_macro_code_rss_1,xyz._4_4_ * 3) !=
        (int)(ref_private_macro_code_rss_1 + xyz._4_4_ * -3) < 0;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      metric[ref_private_macro_code_rss_1] = 0.0;
    }
    if ((int)(xyz._4_4_ * 6) < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7df,
             "ref_part_metric_csv","malloc metric of REF_DBL negative");
      return 1;
    }
    local_460 = malloc((long)(int)(xyz._4_4_ * 6) << 3);
    if (local_460 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7df,
             "ref_part_metric_csv","malloc metric of REF_DBL NULL");
      return 2;
    }
    for (ref_private_macro_code_rss_2 = 0;
        SBORROW4(ref_private_macro_code_rss_2,xyz._4_4_ * 6) !=
        (int)(ref_private_macro_code_rss_2 + xyz._4_4_ * -6) < 0;
        ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
      *(undefined8 *)((long)local_460 + (long)ref_private_macro_code_rss_2 * 8) = 0;
    }
  }
  local_4e0 = ref_mpi_bcast(ref_mpi_00,metric,xyz._4_4_ * 3,3);
  if (local_4e0 == 0) {
    ref_search._4_4_ = ref_mpi_bcast(ref_mpi_00,local_460,xyz._4_4_ * 6,3);
    if (ref_search._4_4_ == 0) {
      ref_node_local._4_4_ = ref_search_create((REF_SEARCH *)&touching,xyz._4_4_);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = ref_list_create((REF_LIST *)&radius);
        if (ref_node_local._4_4_ == 0) {
          for (dist._4_4_ = 0; dist._4_4_ < (int)xyz._4_4_; dist._4_4_ = dist._4_4_ + 1) {
            uVar2 = ref_search_insert((REF_SEARCH)touching,dist._4_4_,metric + dist._4_4_ * 3,0.0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x7ee,"ref_part_metric_csv",(ulong)uVar2,"ins");
              return uVar2;
            }
          }
          for (dist._4_4_ = 0; dist._4_4_ < ref_node->max; dist._4_4_ = dist._4_4_ + 1) {
            if (((-1 < dist._4_4_) && (dist._4_4_ < ref_node->max)) &&
               (-1 < ref_node->global[dist._4_4_])) {
              uVar2 = ref_search_touching((REF_SEARCH)touching,(REF_LIST)radius,
                                          ref_node->real + dist._4_4_ * 0xf,1.0);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x7f4,"ref_part_metric_csv",(ulong)uVar2,"search tree");
                return uVar2;
              }
              m[5] = 1e+200;
              ref_private_macro_code_rss_3 = -1;
              for (ref_private_macro_code_rss_4 = 0; ref_private_macro_code_rss_4 < *(int *)radius;
                  ref_private_macro_code_rss_4 = ref_private_macro_code_rss_4 + 1) {
                iVar1 = *(int *)(*(long *)((long)radius + 8) +
                                (long)ref_private_macro_code_rss_4 * 4);
                dVar4 = pow(ref_node->real[dist._4_4_ * 0xf] - metric[iVar1 * 3],2.0);
                dVar5 = pow(ref_node->real[dist._4_4_ * 0xf + 1] - metric[iVar1 * 3 + 1],2.0);
                dVar6 = pow(ref_node->real[dist._4_4_ * 0xf + 2] - metric[iVar1 * 3 + 2],2.0);
                dVar4 = sqrt(dVar4 + dVar5 + dVar6);
                if (dVar4 < m[5]) {
                  ref_private_macro_code_rss_3 = iVar1;
                  m[5] = dVar4;
                }
              }
              if (ref_private_macro_code_rss_3 == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x802,"ref_part_metric_csv","best not found");
                return 1;
              }
              _item = *(REF_DBL *)((long)local_460 + (long)(ref_private_macro_code_rss_3 * 6) * 8);
              m[0] = *(REF_DBL *)
                      ((long)local_460 + (long)(ref_private_macro_code_rss_3 * 6 + 1) * 8);
              m[1] = *(REF_DBL *)
                      ((long)local_460 + (long)(ref_private_macro_code_rss_3 * 6 + 2) * 8);
              m[2] = *(REF_DBL *)
                      ((long)local_460 + (long)(ref_private_macro_code_rss_3 * 6 + 3) * 8);
              m[3] = *(REF_DBL *)
                      ((long)local_460 + (long)(ref_private_macro_code_rss_3 * 6 + 4) * 8);
              m[4] = *(REF_DBL *)
                      ((long)local_460 + (long)(ref_private_macro_code_rss_3 * 6 + 5) * 8);
              uVar2 = ref_node_metric_set(ref_node,dist._4_4_,(REF_DBL *)&item);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x809,"ref_part_metric_csv",(ulong)uVar2,"set local node met");
                return uVar2;
              }
              uVar2 = ref_list_erase((REF_LIST)radius);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x80a,"ref_part_metric_csv",(ulong)uVar2,"erase");
                return uVar2;
              }
            }
          }
          ref_node_local._4_4_ = ref_list_free((REF_LIST)radius);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = ref_search_free((REF_SEARCH)touching);
            if (ref_node_local._4_4_ == 0) {
              if (metric != (REF_DBL *)0x0) {
                free(metric);
              }
              if (local_460 != (void *)0x0) {
                free(local_460);
              }
              ref_node_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x80d,"ref_part_metric_csv",(ulong)ref_node_local._4_4_,"free search");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x80c,"ref_part_metric_csv",(ulong)ref_node_local._4_4_,"free list");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x7eb,"ref_part_metric_csv",(ulong)ref_node_local._4_4_,"touching list");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x7ea,"ref_part_metric_csv",(ulong)ref_node_local._4_4_,"create search");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7e2,
             "ref_part_metric_csv",(ulong)ref_search._4_4_,"bcast metric");
      ref_node_local._4_4_ = ref_search._4_4_;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x7e1,
           "ref_part_metric_csv",(ulong)local_4e0,"bcast xyz");
    ref_node_local._4_4_ = local_4e0;
  }
  return ref_node_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_part_metric_csv(REF_NODE ref_node,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  FILE *file = NULL;
  char line[1024];
  const char comma[] = ",";
  char *token;
  REF_INT nline, ncol;
  REF_DBL *xyz = NULL, *metric = NULL, col[12];

  if (ref_mpi_once(ref_mpi)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RAS(line == fgets(line, 1024, file), "read header");
    printf("%s\n", line);
    nline = 0;
    while (line == fgets(line, 1024, file)) {
      ncol = 0;
      token = strtok(line, comma);
      while (token != NULL) {
        ncol++;
        token = strtok(NULL, comma);
      }
      if (ncol == 12) nline++;
    }
    printf("nline %d \n", nline);
    ref_malloc_init(xyz, 3 * nline, REF_DBL, 0.0);
    ref_malloc_init(metric, 6 * nline, REF_DBL, 0.0);
    RAS(0 == fseek(file, 0, SEEK_SET), "rewind");
    RAS(line == fgets(line, 1024, file), "read header");
    nline = 0;
    while (line == fgets(line, 1024, file)) {
      ncol = 0;
      token = strtok(line, comma);
      while (token != NULL) {
        RAS(ncol < 12, "too many col");
        col[ncol] = atof(token);
        ncol++;
        token = strtok(NULL, comma);
      }
      if (ncol == 12) {
        metric[0 + 6 * nline] = col[0];
        metric[1 + 6 * nline] = 0.5 * (col[1] + col[3]);
        metric[2 + 6 * nline] = 0.5 * (col[2] + col[6]);
        metric[3 + 6 * nline] = col[4];
        metric[4 + 6 * nline] = 0.5 * (col[5] + col[7]);
        metric[5 + 6 * nline] = col[8];
        xyz[0 + 3 * nline] = col[9];
        xyz[1 + 3 * nline] = col[10];
        xyz[2 + 3 * nline] = col[11];
        nline++;
      }
    }
    fclose(file);
  }
  RSS(ref_mpi_bcast(ref_mpi, &nline, 1, REF_INT_TYPE), "bcast line");
  if (!ref_mpi_once(ref_mpi)) {
    ref_malloc_init(xyz, 3 * nline, REF_DBL, 0.0);
    ref_malloc_init(metric, 6 * nline, REF_DBL, 0.0);
  }
  RSS(ref_mpi_bcast(ref_mpi, xyz, 3 * nline, REF_DBL_TYPE), "bcast xyz");
  RSS(ref_mpi_bcast(ref_mpi, metric, 6 * nline, REF_DBL_TYPE), "bcast metric");
  {
    REF_SEARCH ref_search;
    REF_LIST touching;
    REF_DBL radius;
    REF_INT node, donor;
    REF_DBL dist, best_dist, m[6];
    REF_INT best, item;
    RSS(ref_search_create(&ref_search, nline), "create search");
    RSS(ref_list_create(&touching), "touching list");
    for (node = 0; node < nline; node++) {
      radius = 0.0;
      RSS(ref_search_insert(ref_search, node, &(xyz[3 * node]), radius), "ins");
    }
    each_ref_node_valid_node(ref_node, node) {
      radius = 1.0;
      RSS(ref_search_touching(ref_search, touching,
                              ref_node_xyz_ptr(ref_node, node), radius),
          "search tree");
      best_dist = 1.0e+200;
      best = REF_EMPTY;
      each_ref_list_item(touching, item) {
        donor = ref_list_value(touching, item);
        dist =
            sqrt(pow(ref_node_xyz(ref_node, 0, node) - xyz[0 + 3 * donor], 2) +
                 pow(ref_node_xyz(ref_node, 1, node) - xyz[1 + 3 * donor], 2) +
                 pow(ref_node_xyz(ref_node, 2, node) - xyz[2 + 3 * donor], 2));
        if (dist < best_dist) {
          best_dist = dist;
          best = donor;
        }
      }
      RUS(REF_EMPTY, best, "best not found");
      m[0] = metric[0 + 6 * best];
      m[1] = metric[1 + 6 * best];
      m[2] = metric[2 + 6 * best];
      m[3] = metric[3 + 6 * best];
      m[4] = metric[4 + 6 * best];
      m[5] = metric[5 + 6 * best];
      RSS(ref_node_metric_set(ref_node, node, m), "set local node met");
      RSS(ref_list_erase(touching), "erase");
    }
    RSS(ref_list_free(touching), "free list");
    RSS(ref_search_free(ref_search), "free search");
  }

  ref_free(xyz);
  ref_free(metric);
  return REF_SUCCESS;
}